

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode,LPCWSTR errorMessage)

{
  JsValueRef pvVar1;
  JsErrorCode JVar2;
  int iVar3;
  HRESULT HVar4;
  size_t sourceCount;
  size_t sVar5;
  JsValueRef local_40;
  JsValueRef errorObject;
  JsValueRef errorMessageString;
  char *errorMessageNarrow;
  bool hasException;
  
  if (errorCode != JsNoError) {
    errorMessageNarrow._7_1_ = '\0';
    JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtHasException)
                      ((bool *)((long)&errorMessageNarrow + 7));
    if ((JVar2 != JsNoError) || (errorMessageNarrow._7_1_ == '\0')) {
      iVar3 = PAL_wcscmp(errorMessage,L"");
      if (iVar3 == 0) {
        errorMessage = ConvertErrorCodeToMessage(errorCode);
      }
      sourceCount = PAL_wcslen(errorMessage);
      HVar4 = utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                        (utf8::malloc_allocator::allocate,errorMessage,sourceCount,
                         (LPSTR *)&errorMessageString,(size_t *)&local_40,(size_t *)0x0);
      pvVar1 = errorMessageString;
      if (HVar4 < 0) {
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                  ("Failed to convert wide string. Out of memory?",0x2d,&errorObject);
      }
      else {
        sVar5 = strlen((char *)errorMessageString);
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)((char *)pvVar1,sVar5,&errorObject);
        free(errorMessageString);
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateError)(errorObject,&local_40);
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetException)(local_40);
    }
  }
  return;
}

Assistant:

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode, LPCWSTR errorMessage)
{
    if (errorCode != JsNoError)
    {
        // If the exception is already is set - no need to create a new exception.
        bool hasException = false;
        if (!(ChakraRTInterface::JsHasException(&hasException) == JsNoError && hasException))
        {
            JsValueRef errorObject;
            JsValueRef errorMessageString;

            if (wcscmp(errorMessage, _u("")) == 0)
            {
                errorMessage = ConvertErrorCodeToMessage(errorCode);
            }

            ERROR_MESSAGE_TO_STRING(errCode, errorMessage, errorMessageString);

            ChakraRTInterface::JsCreateError(errorMessageString, &errorObject);
            ChakraRTInterface::JsSetException(errorObject);
        }
    }
}